

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O2

bool __thiscall
vkt::shaderexecutor::FindLSBCaseInstance::compare
          (FindLSBCaseInstance *this,void **inputs,void **outputs)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  pointer pSVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  ulong uVar9;
  ulong uVar10;
  
  pSVar4 = (this->super_IntegerFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = *(uint *)((long)&(pSVar4->varType).m_data + 4);
  uVar5 = glu::getDataTypeScalarSize((pSVar4->varType).m_data.basic.type);
  cVar1 = (&DAT_009f53e8)[(ulong)uVar2 * 4];
  uVar10 = 0;
  uVar9 = 0;
  if (0 < (int)uVar5) {
    uVar9 = (ulong)uVar5;
  }
  do {
    if (uVar9 == uVar10) {
LAB_007a9fc2:
      return (long)(int)uVar5 <= (long)uVar10;
    }
    uVar2 = *(uint *)((long)*inputs + uVar10 * 4);
    iVar3 = *(int *)((long)*outputs + uVar10 * 4);
    iVar6 = shaderexecutor::anon_unknown_0::findLSB(uVar2 & (2 << (cVar1 - 1U & 0x1f)) - 1U);
    iVar7 = shaderexecutor::anon_unknown_0::findLSB(uVar2);
    if ((iVar3 < iVar6) || (iVar7 < iVar3)) {
      poVar8 = std::operator<<((ostream *)&(this->super_IntegerFunctionTestInstance).m_failMsg,
                               "Expected [");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)uVar10);
      poVar8 = std::operator<<(poVar8,"] in range [");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
      poVar8 = std::operator<<(poVar8,", ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar7);
      std::operator<<(poVar8,"]");
      goto LAB_007a9fc2;
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);
		const deUint32			mask			= getLowBitMask(integerLength);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	value	= ((const deUint32*)inputs[0])[compNdx];
			const int		out		= ((const int*)outputs[0])[compNdx];
			const int		minRef	= findLSB(value&mask);
			const int		maxRef	= findLSB(value);

			if (!de::inRange(out, minRef, maxRef))
			{
				m_failMsg << "Expected [" << compNdx << "] in range [" << minRef << ", " << maxRef << "]";
				return false;
			}
		}

		return true;
	}